

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::Classifier::Classifier
          (Classifier *this,string *suffix,CompressorScheme scheme,PixelType type,int cscIdx,
          bool caseInsensitive)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  string *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  _func_int_int *in_stack_ffffffffffffffa0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string((string *)in_RDI._M_current,in_RSI);
  *(undefined4 *)((string *)in_RDI._M_current + 0x20) = in_EDX;
  *(undefined4 *)((string *)in_RDI._M_current + 0x24) = in_ECX;
  *(undefined4 *)((string *)in_RDI._M_current + 0x28) = in_R8D;
  ((string *)in_RDI._M_current)[0x2c] = (string)(in_R9B & 1);
  if ((string)(in_R9B & 1) != (string)0x0) {
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa0)
    ;
  }
  return;
}

Assistant:

Classifier (std::string suffix,
                CompressorScheme scheme,
                PixelType type,
                int cscIdx,
                bool caseInsensitive):
        _suffix(suffix),
        _scheme(scheme),
        _type(type),
        _cscIdx(cscIdx),
        _caseInsensitive(caseInsensitive)
    {
        if (caseInsensitive) 
            std::transform(_suffix.begin(), _suffix.end(), _suffix.begin(), tolower);
    }